

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateFieldAccessor
               (FieldDescriptor *field,bool is_descriptor,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  Type TVar4;
  size_t sVar5;
  Descriptor *pDVar6;
  FieldDescriptor *this;
  FieldDescriptor *this_00;
  long *plVar7;
  EnumDescriptor *pEVar8;
  int32 value;
  int32 extraout_EDX;
  int32 extraout_EDX_00;
  int32 extraout_EDX_01;
  int32 extraout_EDX_02;
  int32 extraout_EDX_03;
  int32 extraout_EDX_04;
  int32 extraout_EDX_05;
  int32 extraout_EDX_06;
  int32 extraout_EDX_07;
  int32 extraout_EDX_08;
  int32 extraout_EDX_09;
  int32 value_00;
  size_type sVar9;
  size_type *psVar10;
  undefined7 in_register_00000031;
  _Alloc_hider _Var11;
  char *pcVar12;
  string out;
  string out_1;
  string local_b8;
  string local_98;
  undefined4 local_78;
  allocator local_72;
  allocator local_71;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_78 = (undefined4)CONCAT71(in_register_00000031,is_descriptor);
  lVar2 = *(long *)(field + 0x60);
  GenerateFieldDocComment(printer,field);
  if (lVar2 == 0) {
    UnderscoresToCamelCase(&local_b8,*(string **)field,true);
    io::Printer::Print(printer,
                       "public function get^camel_name^()\n{\n    return $this->^name^;\n}\n\n",
                       "camel_name",&local_b8,"name",*(string **)field);
  }
  else {
    UnderscoresToCamelCase(&local_b8,*(string **)field,true);
    IntToString_abi_cxx11_(&local_98,(php *)(ulong)*(uint *)(field + 0x38),value);
    io::Printer::Print(printer,
                       "public function get^camel_name^()\n{\n    return $this->readOneof(^number^);\n}\n\n"
                       ,"camel_name",&local_b8,"number",&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  GenerateFieldDocComment(printer,field);
  UnderscoresToCamelCase(&local_b8,*(string **)field,true);
  if (*(int *)(field + 0x4c) == 3) {
    pcVar12 = "&$var";
  }
  else {
    TVar4 = FieldDescriptor::type(field);
    pcVar12 = "$var";
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) {
      pcVar12 = "&$var";
    }
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  sVar5 = strlen(pcVar12);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar12,pcVar12 + sVar5);
  io::Printer::Print(printer,"public function set^camel_name^(^var^)\n{\n","camel_name",&local_b8,
                     "var",&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  bVar3 = FieldDescriptor::is_map(field);
  if (bVar3) {
    pDVar6 = FieldDescriptor::message_type(field);
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"key","");
    this = Descriptor::FindFieldByName(pDVar6,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"value","");
    this_00 = Descriptor::FindFieldByName(pDVar6,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    TVar4 = FieldDescriptor::type(this);
    std::__cxx11::string::string
              ((string *)&local_98,*(char **)(FieldDescriptor::kTypeToName + (ulong)TVar4 * 8),
               &local_71);
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    if (local_b8._M_string_length != 0) {
      sVar9 = 0;
      do {
        if ((byte)(local_b8._M_dataplus._M_p[sVar9] + 0x9fU) < 0x1a) {
          local_b8._M_dataplus._M_p[sVar9] = local_b8._M_dataplus._M_p[sVar9] + -0x20;
        }
        sVar9 = sVar9 + 1;
      } while (local_b8._M_string_length != sVar9);
    }
    TVar4 = FieldDescriptor::type(this_00);
    std::__cxx11::string::string
              ((string *)&local_50,*(char **)(FieldDescriptor::kTypeToName + (ulong)TVar4 * 8),
               &local_72);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_50,local_48 + (long)local_50);
    if (local_70._M_string_length != 0) {
      sVar9 = 0;
      do {
        if ((byte)(local_70._M_dataplus._M_p[sVar9] + 0x9fU) < 0x1a) {
          local_70._M_dataplus._M_p[sVar9] = local_70._M_dataplus._M_p[sVar9] + -0x20;
        }
        sVar9 = sVar9 + 1;
      } while (local_70._M_string_length != sVar9);
    }
    io::Printer::Print(printer,
                       "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
                       ,"key_type",&local_b8,"value_type",&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    TVar4 = FieldDescriptor::type(this_00);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) {
      pDVar6 = FieldDescriptor::message_type(this_00);
      FullClassName<google::protobuf::Descriptor>(&local_98,pDVar6,(bool)(char)local_78);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8.field_2._8_8_ = plVar7[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_b8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      io::Printer::Print(printer,", \\^class_name^);\n","class_name",&local_b8);
      value_00 = extraout_EDX_02;
    }
    else {
      TVar4 = FieldDescriptor::type(this_00);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) != 8) {
LAB_0023717c:
        io::Printer::Print(printer,");\n");
        value_00 = extraout_EDX_01;
        goto LAB_0023737f;
      }
      pEVar8 = FieldDescriptor::enum_type(this_00);
      FullClassName<google::protobuf::EnumDescriptor>(&local_98,pEVar8,(bool)(char)local_78);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8.field_2._8_8_ = plVar7[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_b8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      io::Printer::Print(printer,", \\^class_name^);\n","class_name",&local_b8);
      value_00 = extraout_EDX_05;
    }
LAB_0023734d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      value_00 = extraout_EDX_08;
    }
    _Var11._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0023737f;
  }
  else {
    if (*(int *)(field + 0x4c) == 3) {
      TVar4 = FieldDescriptor::type(field);
      std::__cxx11::string::string
                ((string *)&local_98,*(char **)(FieldDescriptor::kTypeToName + (ulong)TVar4 * 8),
                 (allocator *)&local_70);
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      if (local_b8._M_string_length != 0) {
        sVar9 = 0;
        do {
          if ((byte)(local_b8._M_dataplus._M_p[sVar9] + 0x9fU) < 0x1a) {
            local_b8._M_dataplus._M_p[sVar9] = local_b8._M_dataplus._M_p[sVar9] + -0x20;
          }
          sVar9 = sVar9 + 1;
        } while (local_b8._M_string_length != sVar9);
      }
      io::Printer::Print(printer,
                         "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^"
                         ,"type",&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      TVar4 = FieldDescriptor::type(field);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) {
        pDVar6 = FieldDescriptor::message_type(field);
        FullClassName<google::protobuf::Descriptor>(&local_98,pDVar6,(bool)(char)local_78);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_b8.field_2._M_allocated_capacity = *psVar10;
          local_b8.field_2._8_8_ = plVar7[3];
          local_b8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar10;
          local_b8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_b8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        io::Printer::Print(printer,", \\^class_name^);\n","class_name",&local_b8);
        value_00 = extraout_EDX_04;
      }
      else {
        TVar4 = FieldDescriptor::type(field);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) != 8) goto LAB_0023717c;
        pEVar8 = FieldDescriptor::enum_type(field);
        FullClassName<google::protobuf::EnumDescriptor>(&local_98,pEVar8,(bool)(char)local_78);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_b8.field_2._M_allocated_capacity = *psVar10;
          local_b8.field_2._8_8_ = plVar7[3];
          local_b8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar10;
          local_b8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_b8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        io::Printer::Print(printer,", \\^class_name^);\n","class_name",&local_b8);
        value_00 = extraout_EDX_07;
      }
      goto LAB_0023734d;
    }
    TVar4 = FieldDescriptor::type(field);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) {
      pDVar6 = FieldDescriptor::message_type(field);
      FullClassName<google::protobuf::Descriptor>(&local_b8,pDVar6,(bool)(char)local_78);
      io::Printer::Print(printer,"GPBUtil::checkMessage($var, \\^class_name^::class);\n",
                         "class_name",&local_b8);
      value_00 = extraout_EDX;
    }
    else {
      TVar4 = FieldDescriptor::type(field);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 8) {
        pEVar8 = FieldDescriptor::enum_type(field);
        FullClassName<google::protobuf::EnumDescriptor>(&local_b8,pEVar8,(bool)(char)local_78);
        io::Printer::Print(printer,"GPBUtil::checkEnum($var, \\^class_name^::class);\n","class_name"
                           ,&local_b8);
        value_00 = extraout_EDX_00;
      }
      else {
        TVar4 = FieldDescriptor::type(field);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) != 9) {
          TVar4 = FieldDescriptor::type(field);
          std::__cxx11::string::string
                    ((string *)&local_98,
                     *(char **)(FieldDescriptor::kCppTypeToName +
                               (ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                                               (ulong)TVar4 * 4) * 8),(allocator *)&local_70);
          UnderscoresToCamelCase(&local_b8,&local_98,true);
          io::Printer::Print(printer,"GPBUtil::check^type^($var);\n","type",&local_b8);
          value_00 = extraout_EDX_06;
          goto LAB_0023734d;
        }
        TVar4 = FieldDescriptor::type(field);
        pcVar12 = "False";
        if (TVar4 == TYPE_STRING) {
          pcVar12 = "True";
        }
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,pcVar12,pcVar12 + ((ulong)(TVar4 == TYPE_STRING) ^ 5));
        io::Printer::Print(printer,"GPBUtil::checkString($var, ^utf8^);\n","utf8",&local_b8);
        value_00 = extraout_EDX_03;
      }
    }
    local_98.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    _Var11._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar1) goto LAB_0023737f;
  }
  operator_delete(_Var11._M_p,local_98.field_2._M_allocated_capacity + 1);
  value_00 = extraout_EDX_09;
LAB_0023737f:
  if (lVar2 == 0) {
    if (*(int *)(field + 0x4c) == 3) {
      pcVar12 = "$this->^name^ = $arr;\n";
    }
    else {
      pcVar12 = "$this->^name^ = $var;\n";
    }
    io::Printer::Print(printer,pcVar12,"name",*(string **)field);
  }
  else {
    IntToString_abi_cxx11_(&local_b8,(php *)(ulong)*(uint *)(field + 0x38),value_00);
    io::Printer::Print(printer,"$this->writeOneof(^number^, $var);\n","number",&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)local_78 == '\0') {
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
  }
  else {
    io::Printer::Print(printer,"$this->has_^field_name^ = true;\n","field_name",*(string **)field);
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
    UnderscoresToCamelCase(&local_b8,*(string **)field,true);
    io::Printer::Print(printer,
                       "public function has^camel_name^()\n{\n    return $this->has_^field_name^;\n}\n\n"
                       ,"camel_name",&local_b8,"field_name",*(string **)field);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, bool is_descriptor,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->containing_oneof();

  // Generate getter.
  if (oneof != NULL) {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "number", IntToString(field->number()));
  } else {
    GenerateFieldDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name());
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field);
  printer->Print(
      "public function set^camel_name^(^var^)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true),
      "var", (field->is_repeated() ||
              field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) ?
             "&$var": "$var");

  Indent(printer);

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->FindFieldByName("key");
    const FieldDescriptor* value = map_entry->FindFieldByName("value");
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", ToUpper(key->type_name()),
        "value_type", ToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->message_type(), is_descriptor) + "::class");
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", ToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->message_type(), is_descriptor) + "::class");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print(
        "GPBUtil::checkMessage($var, \\^class_name^::class);\n",
        "class_name", FullClassName(field->message_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print(
        "GPBUtil::checkEnum($var, \\^class_name^::class);\n",
        "class_name", FullClassName(field->enum_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n",
        "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True": "False");
  } else {
    printer->Print(
        "GPBUtil::check^type^($var);\n",
        "type", UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (oneof != NULL) {
    printer->Print(
        "$this->writeOneof(^number^, $var);\n",
        "number", IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print(
        "$this->^name^ = $arr;\n",
        "name", field->name());
  } else {
    printer->Print(
        "$this->^name^ = $var;\n",
        "name", field->name());
  }

  // Set has bit for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "$this->has_^field_name^ = true;\n",
        "field_name", field->name());
  }

  Outdent(printer);

  printer->Print(
      "}\n\n");

  // Generate has method for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    return $this->has_^field_name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "field_name", field->name());
  }
}